

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

SDL_Surface * CreateNullPixelSurface20(int width,int height,Uint32 fmt)

{
  SDL_Surface *pSVar1;
  SDL_Surface *surface20;
  Uint32 fmt_local;
  int height_local;
  int width_local;
  
  pSVar1 = (*SDL20_CreateRGBSurfaceWithFormat)(0,0,0,fmt >> 8 & 0xff,fmt);
  if (pSVar1 != (SDL_Surface *)0x0) {
    pSVar1->flags = pSVar1->flags | 1;
    pSVar1->pixels = (void *)0x0;
    pSVar1->w = width;
    pSVar1->h = height;
    pSVar1->pitch = 0;
    (*SDL20_SetClipRect)(pSVar1,(SDL_Rect *)0x0);
  }
  return pSVar1;
}

Assistant:

static SDL_Surface *
CreateNullPixelSurface20(const int width, const int height, const Uint32 fmt)
{
    SDL_Surface *surface20 = SDL20_CreateRGBSurfaceWithFormat(0, 0, 0, SDL_BITSPERPIXEL(fmt), fmt);
    if (surface20) {
        surface20->flags |= SDL_PREALLOC;
        surface20->pixels = NULL;
        surface20->w = width;
        surface20->h = height;
        surface20->pitch = 0;
        SDL20_SetClipRect(surface20, NULL);
    }
    return surface20;
}